

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommonstyle.cpp
# Opt level: O0

void addIconFiles<int>(QStringView prefix,initializer_list<int> sizes,QIcon *icon,Mode mode,
                      State state)

{
  const_iterator piVar1;
  QLatin1String *in_R8;
  State in_R9D;
  long in_FS_OFFSET;
  int size;
  const_iterator __end0;
  const_iterator __begin0;
  initializer_list<int> *__range1;
  QStringBuilder<QLatin1String,_QStringView_&> fullPrefix;
  int in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  initializer_list<int> *in_stack_fffffffffffffee0;
  QLatin1String *b;
  undefined4 in_stack_fffffffffffffee8;
  int iVar2;
  int *local_108;
  undefined1 local_e8 [8];
  QLatin1StringView local_e0;
  undefined1 local_d0 [104];
  undefined1 local_68 [24];
  QLatin1StringView local_50;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  initializer_list<int> local_28 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_50 = iconResourcePrefix();
  operator+((QLatin1String *)in_stack_fffffffffffffee0,
            (QStringView *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  local_108 = std::initializer_list<int>::begin(local_28);
  piVar1 = std::initializer_list<int>::end(in_stack_fffffffffffffee0);
  for (; local_108 != piVar1; local_108 = local_108 + 1) {
    iVar2 = *local_108;
    b = in_R8;
    QString::number((int)local_d0,iVar2);
    operator+((QStringBuilder<QLatin1String,_QStringView_&> *)
              CONCAT44(iVar2,in_stack_fffffffffffffee8),(QString *)b);
    local_e0 = iconPngSuffix();
    operator+((QStringBuilder<const_QStringBuilder<QLatin1String,_QStringView_&>_&,_QString> *)
              CONCAT44(iVar2,in_stack_fffffffffffffee8),b);
    QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<QStringBuilder<const_QStringBuilder<QLatin1String,_QStringView_&>_&,_QString>,_QLatin1String>
                *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    QSize::QSize((QSize *)b,in_stack_fffffffffffffedc,in_stack_fffffffffffffed8);
    QIcon::addFile((QString *)b,(QSize *)local_68,(Mode)local_e8,in_R9D);
    QString::~QString((QString *)0x3ea27e);
    QStringBuilder<QStringBuilder<const_QStringBuilder<QLatin1String,_QStringView_&>_&,_QString>,_QLatin1String>
    ::~QStringBuilder((QStringBuilder<QStringBuilder<const_QStringBuilder<QLatin1String,_QStringView_&>_&,_QString>,_QLatin1String>
                       *)0x3ea28b);
    QStringBuilder<const_QStringBuilder<QLatin1String,_QStringView_&>_&,_QString>::~QStringBuilder
              ((QStringBuilder<const_QStringBuilder<QLatin1String,_QStringView_&>_&,_QString> *)
               0x3ea295);
    QString::~QString((QString *)0x3ea29f);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void addIconFiles(QStringView prefix, std::initializer_list<T> sizes, QIcon &icon,
                         QIcon::Mode mode = QIcon::Normal, QIcon::State state = QIcon::Off)
{
    const auto fullPrefix = iconResourcePrefix() + prefix;
    for (int size : sizes)
        icon.addFile(fullPrefix + QString::number(size) + iconPngSuffix(),
                     QSize(size, size), mode, state);
}